

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

ACCEPTED_HANDLE accepted_create(void)

{
  AMQP_VALUE pAVar1;
  ACCEPTED_HANDLE local_10;
  ACCEPTED_INSTANCE *accepted_instance;
  
  local_10 = (ACCEPTED_HANDLE)malloc(8);
  if (local_10 != (ACCEPTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x24);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (ACCEPTED_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

ACCEPTED_HANDLE accepted_create(void)
{
    ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)malloc(sizeof(ACCEPTED_INSTANCE));
    if (accepted_instance != NULL)
    {
        accepted_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(36);
        if (accepted_instance->composite_value == NULL)
        {
            free(accepted_instance);
            accepted_instance = NULL;
        }
    }

    return accepted_instance;
}